

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall FactoredDecPOMDPDiscrete::SoftPrint_abi_cxx11_(FactoredDecPOMDPDiscrete *this)

{
  long *in_RSI;
  
  SoftPrint_abi_cxx11_
            ((string *)this,(FactoredDecPOMDPDiscrete *)((long)in_RSI + *(long *)(*in_RSI + -0x180))
            );
  return;
}

Assistant:

string FactoredDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint();
    ss << DecPOMDP::SoftPrint();
    ss << "FactoredDecPOMDPDiscrete contains " << _m_nrLRFs
       << " local reward functions." << endl;
    for(Index i=0;i!=_m_nrLRFs;++i)
    {
        ss << "LRF " << i << " statefactor scope " << _m_sfScopes.at(i)
           << " agent scope " << _m_agScopes.at(i) << endl;
        ss << _m_LRFs.at(i)->SoftPrint() << endl;
    }
    
    //print components specific to FactoredDecPOMDPDiscrete:
    return(ss.str());
}